

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O2

int run_helper_pipe_echo_server(void)

{
  FILE *__stream;
  int err;
  char *pcVar1;
  char *__format;
  uv_fs_t req;
  
  loop = uv_default_loop();
  uv_fs_unlink((uv_loop_t *)0x0,&req,"/tmp/uv-test-sock",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&req);
  server = (uv_handle_t *)&pipeServer;
  serverType = PIPE;
  err = uv_pipe_init(loop,&pipeServer,0);
  if (err == 0) {
    err = uv_pipe_bind(&pipeServer,"/tmp/uv-test-sock");
    if (err == 0) {
      err = uv_listen((uv_stream_t *)&pipeServer,0x1000,on_connection);
      if (err == 0) {
        notify_parent_process();
        uv_run(loop,UV_RUN_DEFAULT);
        return 0;
      }
      __format = "uv_pipe_listen: %s\n";
    }
    else {
      __format = "uv_pipe_bind: %s\n";
    }
  }
  else {
    __format = "uv_pipe_init: %s\n";
  }
  __stream = _stderr;
  pcVar1 = uv_strerror(err);
  fprintf(__stream,__format,pcVar1);
  return 1;
}

Assistant:

HELPER_IMPL(pipe_echo_server) {
  loop = uv_default_loop();

  if (pipe_echo_start(TEST_PIPENAME))
    return 1;

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);
  return 0;
}